

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

bool __thiscall
dap::BasicTypeInfo<dap::optional<dap::ValueFormat>_>::deserialize
          (BasicTypeInfo<dap::optional<dap::ValueFormat>_> *this,Deserializer *d,void *ptr)

{
  bool bVar1;
  void *ptr_local;
  Deserializer *d_local;
  BasicTypeInfo<dap::optional<dap::ValueFormat>_> *this_local;
  
  bVar1 = Deserializer::deserialize<dap::ValueFormat>(d,(optional<dap::ValueFormat> *)ptr);
  return bVar1;
}

Assistant:

inline bool deserialize(const Deserializer* d, void* ptr) const override {
    return d->deserialize(reinterpret_cast<T*>(ptr));
  }